

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O3

void __thiscall
gl4cts::EnhancedLayouts::VaryingLocationsTest::prepareShaderStage
          (VaryingLocationsTest *this,STAGES stage,Type *type,ProgramInterface *program_interface,
          VaryingPassthrough *varying_passthrough)

{
  GLuint GVar1;
  GLuint GVar2;
  pointer puVar3;
  GLchar *text;
  GLchar *text_00;
  STAGES stage_00;
  Type *pTVar4;
  GLint expected_location;
  GLuint GVar5;
  GLint expected_location_00;
  ShaderInterface *this_00;
  Variable *in;
  Variable *in_00;
  Variable *out;
  Variable *out_00;
  char *pcVar6;
  _Alloc_hider _Var7;
  char *__end;
  size_t position;
  GLchar *local_108;
  GLchar *local_100;
  STAGES local_f4;
  Type *local_f0;
  string last_out_name;
  string last_in_name;
  string first_out_name;
  string first_in_name;
  string local_50;
  
  expected_location = TestBase::getLastInputLocation((TestBase *)this,stage,type,1);
  position = 0;
  local_108 = Utils::ProgramInterface::GetStagePrefix::lut[stage][0];
  local_100 = Utils::ProgramInterface::GetStagePrefix::lut[stage][1];
  this_00 = Utils::ProgramInterface::GetShaderInterface(program_interface,stage);
  GVar5 = Utils::Type::GetTypeSize(type->m_basic_type);
  GVar1 = type->m_n_columns;
  GVar2 = type->m_n_rows;
  first_in_name._M_dataplus._M_p = (pointer)&first_in_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&first_in_name,"PREFIXfirst","");
  first_out_name._M_dataplus._M_p = (pointer)&first_out_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&first_out_name,"PREFIXfirst","");
  last_in_name._M_dataplus._M_p = (pointer)&last_in_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&last_in_name,"PREFIXlast","");
  last_out_name._M_dataplus._M_p = (pointer)&last_out_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&last_out_name,"PREFIXlast","");
  text_00 = local_100;
  text = local_108;
  local_f0 = type;
  Utils::replaceToken("PREFIX",&position,local_108,&first_in_name);
  position = 0;
  Utils::replaceToken("PREFIX",&position,text_00,&first_out_name);
  position = 0;
  Utils::replaceToken("PREFIX",&position,text,&last_in_name);
  position = 0;
  Utils::replaceToken("PREFIX",&position,text_00,&last_out_name);
  pTVar4 = local_f0;
  pcVar6 = "layout (location = first_input_location)";
  if (stage == FRAGMENT) {
    pcVar6 = "layout (location = first_input_location) flat";
  }
  local_108 = "layout (location = last_output_location)";
  if (stage == GEOMETRY) {
    local_108 = "layout (location = last_output_location)  flat";
  }
  local_100 = "layout (location = first_output_location)";
  if (stage == GEOMETRY) {
    local_100 = "layout (location = first_output_location) flat";
  }
  puVar3 = (this->m_first_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  in = Utils::ShaderInterface::Input<void>
                 (this_00,first_in_name._M_dataplus._M_p,pcVar6,0,0,local_f0,'\0',0,0,0,puVar3,
                  (long)(this->m_first_data).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar3);
  pcVar6 = "layout (location = last_input_location)";
  if (stage == FRAGMENT) {
    pcVar6 = "layout (location = last_input_location)  flat";
  }
  puVar3 = (this->m_last_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  _Var7 = last_in_name._M_dataplus;
  in_00 = Utils::ShaderInterface::Input<void>
                    (this_00,last_in_name._M_dataplus._M_p,pcVar6,0,expected_location,pTVar4,'\0',0,
                     0,GVar5 * GVar1 * GVar2,puVar3,
                     (long)(this->m_last_data).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish - (long)puVar3);
  pTVar4 = local_f0;
  if (stage == FRAGMENT) {
    prepareGlobals_abi_cxx11_(&local_50,(VaryingLocationsTest *)_Var7._M_p,expected_location,0);
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_f4 = stage;
    expected_location_00 = TestBase::getLastOutputLocation((TestBase *)this,stage,local_f0,1);
    puVar3 = (this->m_first_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    out = Utils::ShaderInterface::Output<void>
                    (this_00,first_out_name._M_dataplus._M_p,local_100,0,0,pTVar4,'\0',0,0,0,puVar3,
                     (long)(this->m_first_data).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish - (long)puVar3);
    puVar3 = (this->m_last_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    _Var7 = last_out_name._M_dataplus;
    out_00 = Utils::ShaderInterface::Output<void>
                       (this_00,last_out_name._M_dataplus._M_p,local_108,0,expected_location_00,
                        pTVar4,'\0',0,0,0,puVar3,
                        (long)(this->m_last_data).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar3);
    stage_00 = local_f4;
    prepareGlobals_abi_cxx11_
              (&local_50,(VaryingLocationsTest *)_Var7._M_p,expected_location,expected_location_00);
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    Utils::VaryingPassthrough::Add(varying_passthrough,stage_00,in,out);
    Utils::VaryingPassthrough::Add(varying_passthrough,stage_00,in_00,out_00);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)last_out_name._M_dataplus._M_p != &last_out_name.field_2) {
    operator_delete(last_out_name._M_dataplus._M_p,last_out_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)last_in_name._M_dataplus._M_p != &last_in_name.field_2) {
    operator_delete(last_in_name._M_dataplus._M_p,last_in_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)first_out_name._M_dataplus._M_p != &first_out_name.field_2) {
    operator_delete(first_out_name._M_dataplus._M_p,first_out_name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)first_in_name._M_dataplus._M_p != &first_in_name.field_2) {
    operator_delete(first_in_name._M_dataplus._M_p,first_in_name.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void VaryingLocationsTest::prepareShaderStage(Utils::Shader::STAGES stage, const Utils::Type& type,
											  Utils::ProgramInterface&   program_interface,
											  Utils::VaryingPassthrough& varying_passthrough)
{
	const GLuint array_length  = 1;
	const GLuint first_in_loc  = 0;
	const GLuint first_out_loc = 0;
	const GLuint last_in_loc   = getLastInputLocation(stage, type, array_length);
	size_t		 position	  = 0;

	const GLchar* prefix_in = Utils::ProgramInterface::GetStagePrefix(stage, Utils::Variable::VARYING_INPUT);

	const GLchar* prefix_out = Utils::ProgramInterface::GetStagePrefix(stage, Utils::Variable::VARYING_OUTPUT);

	const GLchar* qual_first_in  = "layout (location = first_input_location)";
	const GLchar* qual_first_out = "layout (location = first_output_location)";
	const GLchar* qual_last_in   = "layout (location = last_input_location)";
	const GLchar* qual_last_out  = "layout (location = last_output_location)";

	Utils::ShaderInterface& si		  = program_interface.GetShaderInterface(stage);
	const GLuint			type_size = type.GetSize();

	std::string first_in_name  = "PREFIXfirst";
	std::string first_out_name = "PREFIXfirst";
	std::string last_in_name   = "PREFIXlast";
	std::string last_out_name  = "PREFIXlast";

	Utils::replaceToken("PREFIX", position, prefix_in, first_in_name);
	position = 0;
	Utils::replaceToken("PREFIX", position, prefix_out, first_out_name);
	position = 0;
	Utils::replaceToken("PREFIX", position, prefix_in, last_in_name);
	position = 0;
	Utils::replaceToken("PREFIX", position, prefix_out, last_out_name);

	if (Utils::Shader::FRAGMENT == stage)
	{
		qual_first_in = "layout (location = first_input_location) flat";
		qual_last_in  = "layout (location = last_input_location)  flat";
	}
	if (Utils::Shader::GEOMETRY == stage)
	{
		qual_first_out = "layout (location = first_output_location) flat";
		qual_last_out  = "layout (location = last_output_location)  flat";
	}

	Utils::Variable* first_in = si.Input(
		first_in_name.c_str(), qual_first_in /* qualifiers */, 0 /* expected_componenet */,
		first_in_loc /* expected_location */, type /* type */, GL_FALSE /* normalized */, 0u /* n_array_elements */,
		0u /* stride */, 0u /* offset */, (GLvoid*)&m_first_data[0] /* data */, m_first_data.size() /* data_size */);

	Utils::Variable* last_in =
		si.Input(last_in_name.c_str(), qual_last_in /* qualifiers */, 0 /* expected_componenet */,
				 last_in_loc /* expected_location */, type /* type */, GL_FALSE /* normalized */,
				 0u /* n_array_elements */, 0u /* stride */, type_size /* offset */,
				 (GLvoid*)&m_last_data[0] /* data */, m_last_data.size() /* data_size */);

	if (Utils::Shader::FRAGMENT != stage)
	{
		const GLuint last_out_loc = getLastOutputLocation(stage, type, array_length);

		Utils::Variable* first_out =
			si.Output(first_out_name.c_str(), qual_first_out /* qualifiers */, 0 /* expected_componenet */,
					  first_out_loc /* expected_location */, type /* type */, GL_FALSE /* normalized */,
					  0u /* n_array_elements */, 0u /* stride */, 0u /* offset */, (GLvoid*)&m_first_data[0] /* data */,
					  m_first_data.size() /* data_size */);

		Utils::Variable* last_out = si.Output(
			last_out_name.c_str(), qual_last_out /* qualifiers */, 0 /* expected_componenet */,
			last_out_loc /* expected_location */, type /* type */, GL_FALSE /* normalized */, 0u /* n_array_elements */,
			0u /* stride */, 0u /* offset */, (GLvoid*)&m_last_data[0] /* data */, m_last_data.size() /* data_size */);

		si.m_globals = prepareGlobals(last_in_loc, last_out_loc);

		varying_passthrough.Add(stage, first_in, first_out);
		varying_passthrough.Add(stage, last_in, last_out);
	}
	else
	{
		/* No outputs for fragment shader, so last_output_location can be 0 */
		si.m_globals = prepareGlobals(last_in_loc, 0);
	}
}